

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayLen
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayLen *curr)

{
  undefined1 local_90 [8];
  Flow ref;
  long local_30;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_90,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    Flow::getSingleValue((Flow *)local_90);
    ::wasm::Literal::getGCData();
    if (local_30 == 0) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    ref.breakTo.super_IString.str._M_str._0_4_ =
         (int)((*(long *)(local_30 + 0x30) - *(long *)(local_30 + 0x28)) / 0x18) +
         *(int *)(local_30 + 8);
    Flow::Flow(__return_storage_ptr__,(Literal *)&ref.breakTo.super_IString.str._M_str);
    ::wasm::Literal::~Literal((Literal *)&ref.breakTo.super_IString.str._M_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_90);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayLen(ArrayLen* curr) {
    NOTE_ENTER("ArrayLen");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    return Literal(int32_t(data->values.size()));
  }